

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mfsResub.c
# Opt level: O0

int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *p,Abc_Obj_t *pNode,int iFanin,int iFanin2)

{
  uint uVar1;
  Vec_Ptr_t *pVVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  lit lVar10;
  Abc_Obj_t *pAVar11;
  abctime aVar12;
  Hop_Obj_t *pHVar13;
  abctime aVar14;
  uint *p_00;
  void *pvVar15;
  void *pvVar16;
  float fVar17;
  int local_e4;
  Abc_Obj_t *pDiv_1;
  Abc_Obj_t *pDiv;
  Hop_Obj_t *pFunc;
  Abc_Obj_t *pFanin;
  abctime clk;
  int fBreak;
  int nWords;
  int nCands;
  int w;
  int i;
  int iVar2;
  int iVar;
  int RetValue;
  int pCands [12];
  uint *pData2;
  uint *pData;
  int fVeryVerbose;
  int iFanin2_local;
  int iFanin_local;
  Abc_Obj_t *pNode_local;
  Mfs_Man_t *p_local;
  
  bVar3 = false;
  if (p->pPars->fVeryVerbose != 0) {
    iVar5 = Vec_PtrSize(p->vDivs);
    bVar3 = iVar5 < 0x50;
  }
  if (iFanin < 0) {
    __assert_fail("iFanin >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsResub.c"
                  ,0x148,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
  }
  if ((iFanin2 < 0) && (iFanin2 != -1)) {
    __assert_fail("iFanin2 >= 0 || iFanin2 == -1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsResub.c"
                  ,0x149,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
  }
  Vec_PtrFillSimInfo(p->vDivCexes,0,p->nDivWords);
  p->nCexes = 0;
  if (bVar3) {
    printf("\n");
    uVar9 = pNode->Id;
    uVar1 = *(uint *)&pNode->field_0x14;
    iVar5 = Vec_PtrSize(p->vDivs);
    iVar6 = Abc_ObjFaninNum(pNode);
    iVar7 = Abc_ObjFaninNum(pNode);
    pAVar11 = Abc_ObjFanin(pNode,iFanin);
    iVar8 = Abc_ObjFanoutNum(pAVar11);
    if (iVar8 == 1) {
      pAVar11 = Abc_ObjFanin(pNode,iFanin);
      local_e4 = Abc_NodeMffcLabel(pAVar11,(Vec_Ptr_t *)0x0);
    }
    else {
      local_e4 = 0;
    }
    printf("Node %5d : Level = %2d. Divs = %3d.  Fanins = %d/%d (out of %d). MFFC = %d\n",
           (ulong)uVar9,(ulong)(uVar1 >> 0xc),(ulong)(uint)(iVar5 - iVar6),(ulong)(uint)iFanin,
           (ulong)(uint)iFanin2,iVar7,local_e4);
  }
  fBreak = 0;
  Vec_PtrClear(p->vMfsFanins);
  for (nCands = 0; iVar5 = Abc_ObjFaninNum(pNode), nCands < iVar5; nCands = nCands + 1) {
    pAVar11 = Abc_ObjFanin(pNode,nCands);
    if ((nCands != iFanin) && (nCands != iFanin2)) {
      Vec_PtrPush(p->vMfsFanins,pAVar11);
      iVar5 = Vec_PtrSize(p->vDivs);
      iVar6 = Abc_ObjFaninNum(pNode);
      iVar5 = Vec_IntEntry(p->vProjVarsSat,(iVar5 - iVar6) + nCands);
      lVar10 = toLitCond(iVar5,1);
      (&iVar)[fBreak] = lVar10;
      fBreak = fBreak + 1;
    }
  }
  iVar5 = Abc_NtkMfsTryResubOnce(p,&iVar,fBreak);
  if (iVar5 == -1) {
    p_local._4_4_ = 0;
  }
  else if (iVar5 == 1) {
    if (bVar3) {
      printf("Node %d: Fanins %d/%d can be removed.\n",(ulong)(uint)pNode->Id,(ulong)(uint)iFanin,
             (ulong)(uint)iFanin2);
    }
    p->nNodesResub = p->nNodesResub + 1;
    p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
    aVar12 = Abc_Clock();
    pHVar13 = Abc_NtkMfsInterplate(p,&iVar,fBreak);
    if (pHVar13 == (Hop_Obj_t *)0x0) {
      p_local._4_4_ = 0;
    }
    else {
      Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar13);
      aVar14 = Abc_Clock();
      p->timeInt = (aVar14 - aVar12) + p->timeInt;
      p_local._4_4_ = 1;
    }
  }
  else {
    if (bVar3) {
      for (nCands = 0; nCands < 0xb; nCands = nCands + 1) {
        printf(" ");
      }
      nCands = 0;
      while( true ) {
        iVar5 = Vec_PtrSize(p->vDivs);
        iVar6 = Abc_ObjFaninNum(pNode);
        if (iVar5 - iVar6 <= nCands) break;
        printf("%d",(long)nCands % 10 & 0xffffffff);
        nCands = nCands + 1;
      }
      for (nCands = 0; iVar5 = Abc_ObjFaninNum(pNode), nCands < iVar5; nCands = nCands + 1) {
        if ((nCands == iFanin) || (nCands == iFanin2)) {
          printf("*");
        }
        else {
          printf("%c",(ulong)(nCands + 0x61));
        }
      }
      printf("\n");
    }
    w = -1;
    i = -1;
    do {
      if (bVar3) {
        printf("%3d: %2d %2d ",(ulong)(uint)p->nCexes,(ulong)(uint)i,(ulong)(uint)w);
        for (nCands = 0; iVar5 = Vec_PtrSize(p->vDivs), nCands < iVar5; nCands = nCands + 1) {
          p_00 = (uint *)Vec_PtrEntry(p->vDivCexes,nCands);
          uVar9 = Abc_InfoHasBit(p_00,p->nCexes + -1);
          printf("%d",(ulong)uVar9);
        }
        printf("\n");
      }
      iVar5 = Abc_BitWordNum(p->nCexes);
      if (p->nDivWords < iVar5) {
        __assert_fail("nWords <= p->nDivWords",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsResub.c"
                      ,0x195,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
      }
      bVar4 = false;
      i = 1;
      while( true ) {
        iVar6 = Vec_PtrSize(p->vDivs);
        iVar7 = Abc_ObjFaninNum(pNode);
        if (iVar6 - iVar7 <= i) break;
        pvVar15 = Vec_PtrEntry(p->vDivCexes,i);
        if (p->pPars->fPower == 0) {
LAB_005d7b83:
          for (w = 0; w < i; w = w + 1) {
            pvVar16 = Vec_PtrEntry(p->vDivCexes,w);
            if (p->pPars->fPower == 0) {
LAB_005d7bf4:
              nWords = 0;
              while ((nWords < iVar5 &&
                     ((*(uint *)((long)pvVar15 + (long)nWords * 4) |
                      *(uint *)((long)pvVar16 + (long)nWords * 4)) == 0xffffffff))) {
                nWords = nWords + 1;
              }
              if (nWords == iVar5) {
                bVar4 = true;
                break;
              }
            }
            else {
              pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs,w);
              fVar17 = Abc_MfsObjProb(p,pAVar11);
              if (fVar17 < 0.12) goto LAB_005d7bf4;
            }
          }
          if (bVar4) break;
        }
        else {
          pAVar11 = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs,i);
          fVar17 = Abc_MfsObjProb(p,pAVar11);
          if (fVar17 < 0.12) goto LAB_005d7b83;
        }
        i = i + 1;
      }
      iVar5 = Vec_PtrSize(p->vDivs);
      iVar6 = Abc_ObjFaninNum(pNode);
      if (i == iVar5 - iVar6) {
        return 0;
      }
      iVar5 = Vec_IntEntry(p->vProjVarsSat,w);
      lVar10 = toLitCond(iVar5,1);
      (&iVar)[fBreak] = lVar10;
      iVar5 = Vec_IntEntry(p->vProjVarsSat,i);
      lVar10 = toLitCond(iVar5,1);
      (&iVar)[fBreak + 1] = lVar10;
      iVar5 = Abc_NtkMfsTryResubOnce(p,&iVar,fBreak + 2);
      if (iVar5 == -1) {
        return 0;
      }
      if (iVar5 == 1) {
        if (bVar3) {
          printf("Node %d: Fanins %d/%d can be replaced by divisors %d/%d.\n",(ulong)(uint)pNode->Id
                 ,(ulong)(uint)iFanin,(ulong)(uint)iFanin2,(ulong)(uint)i,(ulong)(uint)w);
        }
        p->nNodesResub = p->nNodesResub + 1;
        p->nNodesGainedLevel = p->nNodesGainedLevel + 1;
        aVar12 = Abc_Clock();
        pHVar13 = Abc_NtkMfsInterplate(p,&iVar,fBreak + 2);
        if (pHVar13 == (Hop_Obj_t *)0x0) {
          return 0;
        }
        pVVar2 = p->vMfsFanins;
        pvVar15 = Vec_PtrEntry(p->vDivs,w);
        Vec_PtrPush(pVVar2,pvVar15);
        pVVar2 = p->vMfsFanins;
        pvVar15 = Vec_PtrEntry(p->vDivs,i);
        Vec_PtrPush(pVVar2,pvVar15);
        iVar5 = Vec_PtrSize(p->vMfsFanins);
        if (iVar5 == fBreak + 2) {
          Abc_NtkMfsUpdateNetwork(p,pNode,p->vMfsFanins,pHVar13);
          aVar14 = Abc_Clock();
          p->timeInt = (aVar14 - aVar12) + p->timeInt;
          return 1;
        }
        __assert_fail("Vec_PtrSize(p->vMfsFanins) == nCands + 2",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/mfs/mfsResub.c"
                      ,0x1d1,"int Abc_NtkMfsSolveSatResub2(Mfs_Man_t *, Abc_Obj_t *, int, int)");
      }
    } while (p->nCexes < p->pPars->nWinMax);
    p_local._4_4_ = 0;
  }
  return p_local._4_4_;
}

Assistant:

int Abc_NtkMfsSolveSatResub2( Mfs_Man_t * p, Abc_Obj_t * pNode, int iFanin, int iFanin2 )
{
    int fVeryVerbose = p->pPars->fVeryVerbose && Vec_PtrSize(p->vDivs) < 80;
    unsigned * pData, * pData2;
    int pCands[MFS_FANIN_MAX];
    int RetValue, iVar, iVar2, i, w, nCands, nWords, fBreak;
    abctime clk;
    Abc_Obj_t * pFanin;
    Hop_Obj_t * pFunc;
    assert( iFanin >= 0 );
    assert( iFanin2 >= 0 || iFanin2 == -1 );

    // clean simulation info
    Vec_PtrFillSimInfo( p->vDivCexes, 0, p->nDivWords ); 
    p->nCexes = 0;
    if ( fVeryVerbose )
    {
        printf( "\n" );
        printf( "Node %5d : Level = %2d. Divs = %3d.  Fanins = %d/%d (out of %d). MFFC = %d\n", 
            pNode->Id, pNode->Level, Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode), 
            iFanin, iFanin2, Abc_ObjFaninNum(pNode), 
            Abc_ObjFanoutNum(Abc_ObjFanin(pNode, iFanin)) == 1 ? Abc_NodeMffcLabel(Abc_ObjFanin(pNode, iFanin), NULL) : 0 );
    }

    // try fanins without the critical fanin
    nCands = 0;
    Vec_PtrClear( p->vMfsFanins );
    Abc_ObjForEachFanin( pNode, pFanin, i )
    {
        if ( i == iFanin || i == iFanin2 )
            continue;
        Vec_PtrPush( p->vMfsFanins, pFanin );
        iVar = Vec_PtrSize(p->vDivs) - Abc_ObjFaninNum(pNode) + i;
        pCands[nCands++] = toLitCond( Vec_IntEntry( p->vProjVarsSat, iVar ), 1 );
    }
    RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands );
    if ( RetValue == -1 )
        return 0;
    if ( RetValue == 1 )
    {
        if ( fVeryVerbose )
        printf( "Node %d: Fanins %d/%d can be removed.\n", pNode->Id, iFanin, iFanin2 );
        p->nNodesResub++;
        p->nNodesGainedLevel++;
clk = Abc_Clock();
        // derive the function
        pFunc = Abc_NtkMfsInterplate( p, pCands, nCands );
        if ( pFunc == NULL )
            return 0;
        // update the network
        Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
        return 1;
    }

    if ( fVeryVerbose )
    {
        for ( i = 0; i < 11; i++ )
            printf( " " );
        for ( i = 0; i < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); i++ )
            printf( "%d", i % 10 );
        for ( i = 0; i < Abc_ObjFaninNum(pNode); i++ )
            if ( i == iFanin || i == iFanin2 )
                printf( "*" );
            else
                printf( "%c", 'a' + i );
        printf( "\n" );
    }
    iVar = iVar2 = -1;
    while ( 1 )
    {
#if 1 // sjang
#endif
        if ( fVeryVerbose )
        {
            printf( "%3d: %2d %2d ", p->nCexes, iVar, iVar2 );
            for ( i = 0; i < Vec_PtrSize(p->vDivs); i++ )
            {
                pData = (unsigned *)Vec_PtrEntry( p->vDivCexes, i );
                printf( "%d", Abc_InfoHasBit(pData, p->nCexes-1) );
            }
            printf( "\n" );
        }

        // find the next divisor to try
        nWords = Abc_BitWordNum(p->nCexes);
        assert( nWords <= p->nDivWords );
        fBreak = 0;
        for ( iVar = 1; iVar < Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode); iVar++ )
        {
            pData  = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar );
#if 1  // sjang
            if ( p->pPars->fPower )
            {
                Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar);
                // only accept the divisor if it is "cool"
                if ( Abc_MfsObjProb(p, pDiv) >= 0.12 )
                    continue;
            }
#endif
            for ( iVar2 = 0; iVar2 < iVar; iVar2++ )
            {
                pData2 = (unsigned *)Vec_PtrEntry( p->vDivCexes, iVar2 );
#if 1 // sjang
                if ( p->pPars->fPower )
                {
                    Abc_Obj_t * pDiv = (Abc_Obj_t *)Vec_PtrEntry(p->vDivs, iVar2);
                    // only accept the divisor if it is "cool"
                    if ( Abc_MfsObjProb(p, pDiv) >= 0.12 )
                        continue;
                }
#endif
                for ( w = 0; w < nWords; w++ )
                    if ( (pData[w] | pData2[w]) != ~0 )
                        break;
                if ( w == nWords )
                {
                    fBreak = 1;
                    break;
                }
            }
            if ( fBreak )
                break;
        }
        if ( iVar == Vec_PtrSize(p->vDivs)-Abc_ObjFaninNum(pNode) )
            return 0;

        pCands[nCands]   = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar2), 1 );
        pCands[nCands+1] = toLitCond( Vec_IntEntry(p->vProjVarsSat, iVar), 1 );
        RetValue = Abc_NtkMfsTryResubOnce( p, pCands, nCands+2 );
        if ( RetValue == -1 )
            return 0;
        if ( RetValue == 1 )
        {
            if ( fVeryVerbose )
            printf( "Node %d: Fanins %d/%d can be replaced by divisors %d/%d.\n", pNode->Id, iFanin, iFanin2, iVar, iVar2 );
            p->nNodesResub++;
            p->nNodesGainedLevel++;
clk = Abc_Clock();
            // derive the function
            pFunc = Abc_NtkMfsInterplate( p, pCands, nCands+2 );
            if ( pFunc == NULL )
                return 0;
            // update the network
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar2) );
            Vec_PtrPush( p->vMfsFanins, Vec_PtrEntry(p->vDivs, iVar) );
            assert( Vec_PtrSize(p->vMfsFanins) == nCands + 2 );
            Abc_NtkMfsUpdateNetwork( p, pNode, p->vMfsFanins, pFunc );
p->timeInt += Abc_Clock() - clk;
            return 1;
        }
        if ( p->nCexes >= p->pPars->nWinMax )
            break;
    }
    return 0;
}